

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglBufferAgeTests.cpp
# Opt level: O2

string * __thiscall
deqp::egl::(anonymous_namespace)::generateDrawTypeName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
          *drawTypes)

{
  int iVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  size_t ndx;
  ulong uVar5;
  ostringstream stream;
  allocator<char> local_1a9;
  ostream local_1a8;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  lVar2 = *(long *)this;
  lVar3 = *(long *)(this + 8);
  if (lVar3 == lVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"_none",&local_1a9);
  }
  else {
    for (uVar5 = 0; uVar5 < (ulong)(lVar3 - lVar2 >> 2); uVar5 = uVar5 + 1) {
      iVar1 = *(int *)(lVar2 + uVar5 * 4);
      pcVar4 = "_clear";
      if (iVar1 == 0) {
LAB_00de9091:
        std::operator<<(&local_1a8,pcVar4);
      }
      else if (iVar1 == 1) {
        pcVar4 = "_render";
        goto LAB_00de9091;
      }
      lVar2 = *(long *)this;
      lVar3 = *(long *)(this + 8);
    }
    std::__cxx11::stringbuf::str();
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  return __return_storage_ptr__;
}

Assistant:

string generateDrawTypeName (const vector<BufferAgeTest::DrawType>& drawTypes)
{
	std::ostringstream stream;
	if (drawTypes.size() == 0)
		return string("_none");

	for (size_t ndx = 0; ndx < drawTypes.size(); ndx++)
	{
		if (drawTypes[ndx] == BufferAgeTest::DRAWTYPE_GLES2_RENDER)
			stream << "_render";
		else if (drawTypes[ndx] == BufferAgeTest::DRAWTYPE_GLES2_CLEAR)
			stream << "_clear";
		else
			DE_ASSERT(false);
	}
	return stream.str();
}